

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_listen.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  amqp_rpc_reply_t x_04;
  amqp_rpc_reply_t x_05;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined4 extraout_EDX;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  amqp_envelope_t envelope;
  int local_290 [8];
  undefined1 local_270 [24];
  uint local_258;
  uint local_248;
  undefined8 local_240;
  uint local_238;
  undefined8 local_230;
  byte local_227;
  uint local_220;
  undefined8 local_218;
  size_t local_160;
  void *local_158;
  undefined8 local_110 [4];
  undefined8 local_f0 [4];
  undefined8 local_d0 [4];
  undefined8 local_b0 [4];
  undefined8 local_90 [4];
  undefined8 local_70 [4];
  undefined8 local_50 [4];
  
  if (argc < 5) {
    main_cold_2();
    iVar6 = 1;
  }
  else {
    pcVar1 = argv[1];
    iVar6 = atoi(argv[2]);
    pcVar2 = argv[3];
    pcVar3 = argv[4];
    uVar8 = amqp_new_connection();
    lVar9 = amqp_tcp_socket_new(uVar8);
    if (lVar9 == 0) {
      die("creating TCP socket");
    }
    iVar6 = amqp_socket_open(lVar9,pcVar1,iVar6);
    if (iVar6 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_50,uVar8,"/",0,0x20000,0,0,0x10205f,0x10205f);
    x.reply.id = (int)local_50[1];
    x._0_8_ = local_50[0];
    x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
    x.reply.decoded._0_4_ = (int)local_50[2];
    x.reply.decoded._4_4_ = (int)((ulong)local_50[2] >> 0x20);
    x.library_error = (int)local_50[3];
    x._28_4_ = (int)((ulong)local_50[3] >> 0x20);
    die_on_amqp_error(x,"Logging in");
    iVar6 = 1;
    amqp_channel_open(uVar8,1);
    amqp_get_rpc_reply(local_70,uVar8);
    x_00.reply.id = (int)local_70[1];
    x_00._0_8_ = local_70[0];
    x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
    x_00.reply.decoded._0_4_ = (int)local_70[2];
    x_00.reply.decoded._4_4_ = (int)((ulong)local_70[2] >> 0x20);
    x_00.library_error = (int)local_70[3];
    x_00._28_4_ = (int)((ulong)local_70[3] >> 0x20);
    die_on_amqp_error(x_00,"Opening channel");
    uVar5 = _amqp_socket_open;
    uVar4 = _amqp_empty_bytes;
    puVar10 = (undefined8 *)
              amqp_queue_declare(uVar8,1,_amqp_empty_bytes,_amqp_socket_open,0,0,0,1,
                                 _amqp_empty_table,_putchar);
    amqp_get_rpc_reply(local_90,uVar8);
    x_01.reply.id = (int)local_90[1];
    x_01._0_8_ = local_90[0];
    x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
    x_01.reply.decoded._0_4_ = (int)local_90[2];
    x_01.reply.decoded._4_4_ = (int)((ulong)local_90[2] >> 0x20);
    x_01.library_error = (int)local_90[3];
    x_01._28_4_ = (int)((ulong)local_90[3] >> 0x20);
    die_on_amqp_error(x_01,"Declaring queue");
    auVar11 = amqp_bytes_malloc_dup(*puVar10,puVar10[1]);
    lVar9 = auVar11._8_8_;
    if (lVar9 == 0) {
      main_cold_1();
    }
    else {
      auVar12 = amqp_cstring_bytes(pcVar2);
      uVar7 = amqp_cstring_bytes(pcVar3);
      amqp_queue_bind(uVar8,1,auVar11._0_8_,lVar9,auVar12._0_8_,auVar12._8_8_,uVar7,extraout_EDX,
                      _amqp_empty_table,_putchar);
      amqp_get_rpc_reply(local_b0,uVar8);
      x_02.reply.id = (int)local_b0[1];
      x_02._0_8_ = local_b0[0];
      x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
      x_02.reply.decoded._0_4_ = (int)local_b0[2];
      x_02.reply.decoded._4_4_ = (int)((ulong)local_b0[2] >> 0x20);
      x_02.library_error = (int)local_b0[3];
      x_02._28_4_ = (int)((ulong)local_b0[3] >> 0x20);
      die_on_amqp_error(x_02,"Binding queue");
      amqp_basic_consume(uVar8,1,auVar11._0_8_,lVar9,uVar4,uVar5,0,1,0,_amqp_empty_table,_putchar);
      amqp_get_rpc_reply(local_d0,uVar8);
      x_03.reply.id = (int)local_d0[1];
      x_03._0_8_ = local_d0[0];
      x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
      x_03.reply.decoded._0_4_ = (int)local_d0[2];
      x_03.reply.decoded._4_4_ = (int)((ulong)local_d0[2] >> 0x20);
      x_03.library_error = (int)local_d0[3];
      x_03._28_4_ = (int)((ulong)local_d0[3] >> 0x20);
      die_on_amqp_error(x_03,"Consuming");
      amqp_maybe_release_buffers(uVar8);
      amqp_consume_message(local_290,uVar8,local_270,0,0);
      if (local_290[0] == 1) {
        do {
          printf("Delivery %u, exchange %.*s routingkey %.*s\n",(ulong)local_258,(ulong)local_248,
                 local_240,(ulong)local_238,local_230);
          if ((local_227 & 0x80) != 0) {
            printf("Content-type: %.*s\n",(ulong)local_220,local_218);
          }
          puts("----");
          amqp_dump(local_158,local_160);
          amqp_destroy_envelope(local_270);
          amqp_maybe_release_buffers(uVar8);
          amqp_consume_message(local_290,uVar8,local_270,0,0);
        } while (local_290[0] == 1);
      }
      amqp_channel_close(local_f0,uVar8,1,200);
      x_04.reply.id = (int)local_f0[1];
      x_04._0_8_ = local_f0[0];
      x_04.reply._4_4_ = (int)((ulong)local_f0[1] >> 0x20);
      x_04.reply.decoded._0_4_ = (int)local_f0[2];
      x_04.reply.decoded._4_4_ = (int)((ulong)local_f0[2] >> 0x20);
      x_04.library_error = (int)local_f0[3];
      x_04._28_4_ = (int)((ulong)local_f0[3] >> 0x20);
      die_on_amqp_error(x_04,"Closing channel");
      amqp_connection_close(local_110,uVar8,200);
      x_05.reply.id = (int)local_110[1];
      x_05._0_8_ = local_110[0];
      x_05.reply._4_4_ = (int)((ulong)local_110[1] >> 0x20);
      x_05.reply.decoded._0_4_ = (int)local_110[2];
      x_05.reply.decoded._4_4_ = (int)((ulong)local_110[2] >> 0x20);
      x_05.library_error = (int)local_110[3];
      x_05._28_4_ = (int)((ulong)local_110[3] >> 0x20);
      die_on_amqp_error(x_05,"Closing connection");
      iVar6 = amqp_destroy_connection(uVar8);
      die_on_error(iVar6,"Ending connection");
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *bindingkey;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  amqp_bytes_t queuename;

  if (argc < 5) {
    fprintf(stderr, "Usage: amqp_listen host port exchange bindingkey\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  bindingkey = argv[4];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  {
    amqp_queue_declare_ok_t *r = amqp_queue_declare(conn, 1, amqp_empty_bytes, 0, 0, 0, 1,
                                 amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring queue");
    queuename = amqp_bytes_malloc_dup(r->queue);
    if (queuename.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
  }

  amqp_queue_bind(conn, 1, queuename, amqp_cstring_bytes(exchange), amqp_cstring_bytes(bindingkey),
                  amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Binding queue");

  amqp_basic_consume(conn, 1, queuename, amqp_empty_bytes, 0, 1, 0, amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Consuming");

  {
    while (1) {
      amqp_rpc_reply_t res;
      amqp_envelope_t envelope;

      amqp_maybe_release_buffers(conn);

      res = amqp_consume_message(conn, &envelope, NULL, 0);

      if (AMQP_RESPONSE_NORMAL != res.reply_type) {
        break;
      }

      printf("Delivery %u, exchange %.*s routingkey %.*s\n",
             (unsigned) envelope.delivery_tag,
             (int) envelope.exchange.len, (char *) envelope.exchange.bytes,
             (int) envelope.routing_key.len, (char *) envelope.routing_key.bytes);

      if (envelope.message.properties._flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        printf("Content-type: %.*s\n",
               (int) envelope.message.properties.content_type.len,
               (char *) envelope.message.properties.content_type.bytes);
      }
      printf("----\n");

      amqp_dump(envelope.message.body.bytes, envelope.message.body.len);

      amqp_destroy_envelope(&envelope);
    }
  }

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  return 0;
}